

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall
c4::yml::Parser::_location_from_node(Parser *this,Tree *tree,size_t node,Location *loc,size_t level)

{
  bool bVar1;
  error_flags eVar2;
  NodeData *pNVar3;
  csubstr *pcVar4;
  ulong *puVar5;
  NodeType NVar6;
  size_t sVar7;
  void *in_RCX;
  Tree *in_RDX;
  Parser *in_RSI;
  long in_RDI;
  Location *in_R8;
  size_t parent;
  size_t next;
  size_t prev;
  char msg_3 [34];
  char msg_2 [32];
  csubstr v;
  char msg_1 [34];
  char msg [32];
  csubstr k;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  char *in_stack_fffffffffffffc08;
  Location *in_stack_fffffffffffffc10;
  bool local_3e1;
  size_t in_stack_fffffffffffffc38;
  Tree *in_stack_fffffffffffffc40;
  char *pcVar8;
  Tree *in_stack_fffffffffffffc48;
  code *pcVar9;
  bool local_3aa;
  bool local_3a9;
  bool local_36a;
  bool local_369;
  undefined1 local_338 [32];
  Location *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined1 local_2e8 [40];
  char *local_2c0;
  size_t local_2b8;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  char *local_290;
  char local_288 [32];
  ro_substr local_268;
  char *local_258;
  size_t local_250;
  undefined1 local_248 [80];
  undefined1 local_1f8 [40];
  char *local_1d0;
  size_t local_1c8;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  char *local_1a0;
  char local_198 [32];
  ro_substr local_178;
  char *local_168;
  size_t in_stack_fffffffffffffea0;
  char *local_88;
  size_t local_80;
  char **local_78;
  char *local_70;
  size_t local_68;
  bool local_59;
  char *local_58;
  size_t local_50;
  char **local_48;
  char *local_40;
  size_t local_38;
  char **local_30;
  char *local_28;
  size_t local_20;
  bool local_11;
  NodeData *local_10;
  NodeData *local_8;
  
  pNVar3 = Tree::_p(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  if (((pNVar3->m_type).type & KEY) != NOTYPE) {
    pcVar4 = Tree::key(in_stack_fffffffffffffc48,(size_t)in_stack_fffffffffffffc40);
    local_168 = pcVar4->str;
    in_stack_fffffffffffffea0 = pcVar4->len;
    if (local_168 != (char *)0x0) {
      local_178 = basic_substring::operator_cast_to_basic_substring
                            ((basic_substring<char> *)0x3cf063);
      local_40 = local_178.str;
      local_38 = local_178.len;
      local_48 = &local_168;
      local_58 = local_168;
      local_30 = &local_40;
      if (local_178.len == 0) {
        local_36a = false;
        if ((in_stack_fffffffffffffea0 == 0) && (local_36a = false, local_168 == local_178.str)) {
          local_36a = local_178.str != (char *)0x0;
        }
        local_11 = local_36a;
      }
      else {
        local_369 = local_178.str <= local_168 &&
                    local_168 + in_stack_fffffffffffffea0 <= local_178.str + local_178.len;
        local_11 = local_369;
      }
      local_1c8 = in_stack_fffffffffffffea0;
      local_50 = in_stack_fffffffffffffea0;
      local_28 = local_58;
      local_20 = in_stack_fffffffffffffea0;
      if (local_11 == false) {
        builtin_strncpy(local_198,"check failed: (k.is_sub(m_buf))",0x20);
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        pcVar9 = *(code **)(in_RDI + 0x9e8);
        Location::Location(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                           CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                           CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                           CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
        (*pcVar9)(local_198,0x20,*(undefined8 *)(in_RDI + 0x9d0));
        in_stack_fffffffffffffbf0 = uStack_1b8;
        in_stack_fffffffffffffbf4 = uStack_1b4;
        in_stack_fffffffffffffbf8 = local_1b0;
        in_stack_fffffffffffffbfc = uStack_1ac;
        in_stack_fffffffffffffc00 = uStack_1a8;
        in_stack_fffffffffffffc04 = uStack_1a4;
        in_stack_fffffffffffffc08 = local_1a0;
        local_1c8 = in_stack_fffffffffffffea0;
      }
      puVar5 = (ulong *)(in_RDI + 0x18);
      local_1d0 = local_168;
      if (*(long *)(in_RDI + 0x20) == 0) {
        bVar1 = false;
        if ((local_1c8 == 0) && (bVar1 = false, local_168 == (char *)*puVar5)) {
          bVar1 = *puVar5 != 0;
        }
      }
      else {
        bVar1 = false;
        if ((char *)*puVar5 <= local_168) {
          bVar1 = local_168 + local_1c8 <= (char *)(*puVar5 + *(long *)(in_RDI + 0x20));
        }
      }
      if (!bVar1) {
        memcpy(local_1f8,"check failed: (m_buf.is_super(k))",0x22);
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        pcVar9 = *(code **)(in_RDI + 0x9e8);
        Location::Location(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                           CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                           CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                           CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
        (*pcVar9)(local_1f8,0x22,*(undefined8 *)(in_RDI + 0x9d0));
      }
      val_location((Parser *)v.len,v.str);
      memcpy(in_RCX,local_248,0x28);
      return true;
    }
    local_168 = (char *)0x0;
  }
  local_10 = Tree::_p(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  if (((local_10->m_type).type & VAL) != NOTYPE) {
    pcVar4 = Tree::val(in_stack_fffffffffffffc48,(size_t)in_stack_fffffffffffffc40);
    local_258 = pcVar4->str;
    local_250 = pcVar4->len;
    if (local_258 != (char *)0x0) {
      local_268 = basic_substring::operator_cast_to_basic_substring
                            ((basic_substring<char> *)0x3cf59d);
      local_88 = local_268.str;
      local_80 = local_268.len;
      local_70 = local_258;
      local_68 = local_250;
      local_78 = &local_88;
      if (local_268.len == 0) {
        local_3aa = false;
        if ((local_250 == 0) && (local_3aa = false, local_258 == local_268.str)) {
          local_3aa = local_268.str != (char *)0x0;
        }
        local_59 = local_3aa;
      }
      else {
        local_3a9 = local_268.str <= local_258 &&
                    local_258 + local_250 <= local_268.str + local_268.len;
        local_59 = local_3a9;
      }
      if (local_59 == false) {
        builtin_strncpy(local_288,"check failed: (v.is_sub(m_buf))",0x20);
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        pcVar9 = *(code **)(in_RDI + 0x9e8);
        pcVar8 = local_288;
        Location::Location(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                           CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                           CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                           CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
        (*pcVar9)(pcVar8,0x20,*(undefined8 *)(in_RDI + 0x9d0));
        in_stack_fffffffffffffbf0 = uStack_2a8;
        in_stack_fffffffffffffbf4 = uStack_2a4;
        in_stack_fffffffffffffbf8 = local_2a0;
        in_stack_fffffffffffffbfc = uStack_29c;
        in_stack_fffffffffffffc00 = uStack_298;
        in_stack_fffffffffffffc04 = uStack_294;
        in_stack_fffffffffffffc08 = local_290;
      }
      puVar5 = (ulong *)(in_RDI + 0x18);
      local_2c0 = local_258;
      local_2b8 = local_250;
      if (*(long *)(in_RDI + 0x20) == 0) {
        bVar1 = false;
        if ((local_250 == 0) && (bVar1 = false, local_258 == (char *)*puVar5)) {
          bVar1 = *puVar5 != 0;
        }
      }
      else {
        bVar1 = false;
        if ((char *)*puVar5 <= local_258) {
          bVar1 = local_258 + local_250 <= (char *)(*puVar5 + *(long *)(in_RDI + 0x20));
        }
      }
      if (!bVar1) {
        memcpy(local_2e8,"check failed: (m_buf.is_super(v))",0x22);
        eVar2 = get_error_flags();
        if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
          trap_instruction();
        }
        pcVar9 = *(code **)(in_RDI + 0x9e8);
        Location::Location(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                           CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                           CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                           CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
        (*pcVar9)(local_2e8,0x22,*(undefined8 *)(in_RDI + 0x9d0));
      }
      val_location((Parser *)v.len,v.str);
      memcpy(in_RCX,local_338,0x28);
      return true;
    }
    local_258 = (char *)0x0;
  }
  local_8 = Tree::_p(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  if ((((local_8->m_type).type & (STREAM|MAP)) != NOTYPE) &&
     (bVar1 = _location_from_cont((Parser *)
                                  CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                  (Tree *)CONCAT44(in_stack_fffffffffffffcfc,
                                                   in_stack_fffffffffffffcf8),
                                  CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                                  in_stack_fffffffffffffce8), bVar1)) {
    return true;
  }
  NVar6 = Tree::type((Tree *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),0x3cfa7a)
  ;
  local_3e1 = NVar6.type != NOTYPE && in_R8 == (Location *)0x0;
  if (local_3e1) {
    sVar7 = Tree::prev_sibling((Tree *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0)
                               ,CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    if ((sVar7 != 0xffffffffffffffff) &&
       (bVar1 = _location_from_node(in_RSI,in_RDX,(size_t)in_RCX,in_R8,in_stack_fffffffffffffea0),
       bVar1)) {
      return true;
    }
    sVar7 = Tree::next_sibling((Tree *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0)
                               ,CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    if ((sVar7 != 0xffffffffffffffff) &&
       (bVar1 = _location_from_node(in_RSI,in_RDX,(size_t)in_RCX,in_R8,in_stack_fffffffffffffea0),
       bVar1)) {
      return true;
    }
    sVar7 = Tree::parent((Tree *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                         CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
    if ((sVar7 != 0xffffffffffffffff) &&
       (bVar1 = _location_from_node(in_RSI,in_RDX,(size_t)in_RCX,in_R8,in_stack_fffffffffffffea0),
       bVar1)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Parser::_location_from_node(Tree const& tree, size_t node, Location *C4_RESTRICT loc, size_t level) const
{
    if(tree.has_key(node))
    {
        csubstr k = tree.key(node);
        if(C4_LIKELY(k.str != nullptr))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, k.is_sub(m_buf));
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(k));
            *loc = val_location(k.str);
            return true;
        }
    }

    if(tree.has_val(node))
    {
        csubstr v = tree.val(node);
        if(C4_LIKELY(v.str != nullptr))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, v.is_sub(m_buf));
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(v));
            *loc = val_location(v.str);
            return true;
        }
    }

    if(tree.is_container(node))
    {
        if(_location_from_cont(tree, node, loc))
            return true;
    }

    if(tree.type(node) != NOTYPE && level == 0)
    {
        // try the prev sibling
        {
            const size_t prev = tree.prev_sibling(node);
            if(prev != NONE)
            {
                if(_location_from_node(tree, prev, loc, level+1))
                    return true;
            }
        }
        // try the next sibling
        {
            const size_t next = tree.next_sibling(node);
            if(next != NONE)
            {
                if(_location_from_node(tree, next, loc, level+1))
                    return true;
            }
        }
        // try the parent
        {
            const size_t parent = tree.parent(node);
            if(parent != NONE)
            {
                if(_location_from_node(tree, parent, loc, level+1))
                    return true;
            }
        }
    }

    return false;
}